

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O2

void __thiscall
ruckig::BrakeProfile::get_position_brake_trajectory
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double aMax,double aMin,
          double jMax)

{
  double dVar1;
  double dVar2;
  
  (this->j)._M_elems[0] = 0.0;
  (this->j)._M_elems[1] = 0.0;
  (this->t)._M_elems[0] = 0.0;
  (this->t)._M_elems[1] = 0.0;
  if ((((aMin != 0.0) || (NAN(aMin))) && ((aMax != 0.0 || (NAN(aMax))))) &&
     ((jMax != 0.0 || (NAN(jMax))))) {
    if (aMax < a0) {
      acceleration_brake(this,v0,a0,vMax,vMin,aMax,aMin,jMax);
      return;
    }
    if (a0 < aMin) {
      acceleration_brake(this,v0,a0,vMin,vMax,aMin,aMax,-jMax);
      return;
    }
    dVar1 = a0 * a0;
    dVar2 = jMax + jMax;
    if (((vMax < v0) && (vMin < v0 - dVar1 / dVar2)) || ((0.0 < a0 && (vMax < dVar1 / dVar2 + v0))))
    {
      velocity_brake(this,v0,a0,vMax,vMin,vMax,aMin,jMax);
      return;
    }
    if (((v0 < vMin) && (dVar1 / dVar2 + v0 < vMax)) || ((a0 < 0.0 && (v0 - dVar1 / dVar2 < vMin))))
    {
      velocity_brake(this,v0,a0,vMin,vMax,vMax,aMax,-jMax);
      return;
    }
  }
  return;
}

Assistant:

void BrakeProfile::get_position_brake_trajectory(double v0, double a0, double vMax, double vMin, double aMax, double aMin, double jMax) {
    t[0] = 0.0;
    t[1] = 0.0;
    j[0] = 0.0;
    j[1] = 0.0;

    if (jMax == 0.0 || aMax == 0.0 || aMin == 0.0) {
        return; // Ignore braking for zero-limits
    }

    if (a0 > aMax) {
        acceleration_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if (a0 < aMin) {
        acceleration_brake(v0, a0, vMin, vMax, aMin, aMax, -jMax);

    } else if ((v0 > vMax && v_at_a_zero(v0, a0, -jMax) > vMin) || (a0 > 0 && v_at_a_zero(v0, a0, jMax) > vMax)) {
        velocity_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if ((v0 < vMin && v_at_a_zero(v0, a0, jMax) < vMax) || (a0 < 0 && v_at_a_zero(v0, a0, -jMax) < vMin)) {
        velocity_brake(v0, a0, vMin, vMax, aMin, aMax, -jMax);
    }
}